

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O1

EVP_PKEY * EVP_PKEY_new(void)

{
  EVP_PKEY *pEVar1;
  
  pEVar1 = (EVP_PKEY *)OPENSSL_zalloc(0x18);
  if (pEVar1 == (EVP_PKEY *)0x0) {
    pEVar1 = (EVP_PKEY *)0x0;
  }
  else {
    pEVar1->type = 1;
    pEVar1->save_type = 0;
  }
  return pEVar1;
}

Assistant:

EVP_PKEY *EVP_PKEY_new(void) {
  EVP_PKEY *ret =
      reinterpret_cast<EVP_PKEY *>(OPENSSL_zalloc(sizeof(EVP_PKEY)));
  if (ret == NULL) {
    return NULL;
  }

  ret->type = EVP_PKEY_NONE;
  ret->references = 1;
  return ret;
}